

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_DXT.c
# Opt level: O0

int save_image_as_DDS(char *filename,int width,int height,int channels,uchar *data)

{
  FILE *__s;
  uint local_c4 [2];
  int DDS_size;
  DDS_header header;
  uchar *DDS_data;
  FILE *fout;
  uchar *data_local;
  int channels_local;
  int height_local;
  int width_local;
  char *filename_local;
  
  if ((((filename == (char *)0x0) || (width < 1)) || (height < 1)) ||
     (((channels < 1 || (4 < channels)) || (data == (uchar *)0x0)))) {
    filename_local._4_4_ = 0;
  }
  else {
    if ((channels & 1U) == 1) {
      header._120_8_ = convert_image_to_DXT1(data,width,height,channels,(int *)local_c4);
    }
    else {
      header._120_8_ = convert_image_to_DXT5(data,width,height,channels,(int *)local_c4);
    }
    memset(local_c4 + 1,0,0x80);
    local_c4[1] = 0x20534444;
    DDS_size = 0x7c;
    header.dwMagic = 0x81007;
    header.dwHeight = local_c4[0];
    header.dwReserved1[9] = 0x20;
    header.dwReserved1[10] = 4;
    if ((channels & 1U) == 1) {
      header.sPixelFormat.dwSize = 0x31545844;
    }
    else {
      header.sPixelFormat.dwSize = 0x35545844;
    }
    header.sPixelFormat.dwBBitMask = 0x1000;
    header.dwSize = height;
    header.dwFlags = width;
    __s = fopen(filename,"wb");
    fwrite(local_c4 + 1,0x80,1,__s);
    fwrite((void *)header._120_8_,1,(long)(int)local_c4[0],__s);
    fclose(__s);
    free((void *)header._120_8_);
    filename_local._4_4_ = 1;
  }
  return filename_local._4_4_;
}

Assistant:

int
	save_image_as_DDS
	(
		const char *filename,
		int width, int height, int channels,
		const unsigned char *const data
	)
{
	/*	variables	*/
	FILE *fout;
	unsigned char *DDS_data;
	DDS_header header;
	int DDS_size;
	/*	error check	*/
	if( (NULL == filename) ||
		(width < 1) || (height < 1) ||
		(channels < 1) || (channels > 4) ||
		(data == NULL ) )
	{
		return 0;
	}
	/*	Convert the image	*/
	if( (channels & 1) == 1 )
	{
		/*	no alpha, just use DXT1	*/
		DDS_data = convert_image_to_DXT1( data, width, height, channels, &DDS_size );
	} else
	{
		/*	has alpha, so use DXT5	*/
		DDS_data = convert_image_to_DXT5( data, width, height, channels, &DDS_size );
	}
	/*	save it	*/
	memset( &header, 0, sizeof( DDS_header ) );
	header.dwMagic = ('D' << 0) | ('D' << 8) | ('S' << 16) | (' ' << 24);
	header.dwSize = 124;
	header.dwFlags = DDSD_CAPS | DDSD_HEIGHT | DDSD_WIDTH | DDSD_PIXELFORMAT | DDSD_LINEARSIZE;
	header.dwWidth = width;
	header.dwHeight = height;
	header.dwPitchOrLinearSize = DDS_size;
	header.sPixelFormat.dwSize = 32;
	header.sPixelFormat.dwFlags = DDPF_FOURCC;
	if( (channels & 1) == 1 )
	{
		header.sPixelFormat.dwFourCC = ('D' << 0) | ('X' << 8) | ('T' << 16) | ('1' << 24);
	} else
	{
		header.sPixelFormat.dwFourCC = ('D' << 0) | ('X' << 8) | ('T' << 16) | ('5' << 24);
	}
	header.sCaps.dwCaps1 = DDSCAPS_TEXTURE;
	/*	write it out	*/
	fout = fopen( filename, "wb");
	fwrite( &header, sizeof( DDS_header ), 1, fout );
	fwrite( DDS_data, 1, DDS_size, fout );
	fclose( fout );
	/*	done	*/
	free( DDS_data );
	return 1;
}